

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O0

void randomx_calculate_hash(randomx_vm *machine,void *input,size_t inputSize,void *output)

{
  undefined8 in_RCX;
  randomx_vm *in_RDI;
  int chain;
  int blakeResult;
  uint64_t tempHash [8];
  fenv_t fpstate;
  int local_90;
  undefined1 local_88 [72];
  fenv_t local_40;
  undefined8 local_20;
  randomx_vm *local_8;
  
  local_20 = in_RCX;
  local_8 = in_RDI;
  fegetenv(&local_40);
  randomx_blake2b((void *)inputSize,(size_t)output,(void *)fpstate._24_8_,fpstate._16_8_,
                  (void *)fpstate._8_8_,fpstate._0_8_);
  (*local_8->_vptr_randomx_vm[7])(local_8,local_88);
  randomx_vm::resetRoundingMode((randomx_vm *)0x13c6d9);
  for (local_90 = 0; local_90 < 1; local_90 = local_90 + 1) {
    (*local_8->_vptr_randomx_vm[8])(local_8,local_88);
    randomx_vm::getRegisterFile(local_8);
    randomx_blake2b((void *)inputSize,(size_t)output,(void *)fpstate._24_8_,fpstate._16_8_,
                    (void *)fpstate._8_8_,fpstate._0_8_);
  }
  (*local_8->_vptr_randomx_vm[8])(local_8,local_88);
  (*local_8->_vptr_randomx_vm[3])(local_8,local_20,0x20);
  fesetenv(&local_40);
  return;
}

Assistant:

void randomx_calculate_hash(randomx_vm *machine, const void *input, size_t inputSize, void *output) {
		assert(machine != nullptr);
		assert(inputSize == 0 || input != nullptr);
		assert(output != nullptr);
		fenv_t fpstate;
		fegetenv(&fpstate);
		alignas(16) uint64_t tempHash[8];
		int blakeResult = blake2b(tempHash, sizeof(tempHash), input, inputSize, nullptr, 0);
		assert(blakeResult == 0);
		machine->initScratchpad(&tempHash);
		machine->resetRoundingMode();
		for (int chain = 0; chain < RANDOMX_PROGRAM_COUNT - 1; ++chain) {
			machine->run(&tempHash);
			blakeResult = blake2b(tempHash, sizeof(tempHash), machine->getRegisterFile(), sizeof(randomx::RegisterFile), nullptr, 0);
			assert(blakeResult == 0);
		}
		machine->run(&tempHash);
		machine->getFinalResult(output, RANDOMX_HASH_SIZE);
		fesetenv(&fpstate);
	}